

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# load.c
# Opt level: O0

wchar_t rd_gear_aux(rd_item_t rd_item_version,object **gear)

{
  object *poVar1;
  object *obj;
  object *last_gear_obj;
  object **ppoStack_20;
  uint8_t code;
  object **gear_local;
  rd_item_t rd_item_version_local;
  
  obj = (object *)0x0;
  ppoStack_20 = gear;
  gear_local = (object **)rd_item_version;
  rd_byte((uint8_t *)((long)&last_gear_obj + 7));
  while( true ) {
    if (last_gear_obj._7_1_ == 0xff) {
      return L'\0';
    }
    poVar1 = (object *)(*(code *)gear_local)();
    if (poVar1 == (object *)0x0) break;
    poVar1->prev = obj;
    if (obj == (object *)0x0) {
      *ppoStack_20 = poVar1;
    }
    else {
      obj->next = poVar1;
    }
    if ((ushort)last_gear_obj._7_1_ < (player->body).count) {
      (player->body).slots[last_gear_obj._7_1_].obj = poVar1;
      player->upkeep->equip_cnt = player->upkeep->equip_cnt + L'\x01';
    }
    rd_byte((uint8_t *)((long)&last_gear_obj + 7));
    obj = poVar1;
  }
  note("Error reading item");
  return L'\xffffffff';
}

Assistant:

static int rd_gear_aux(rd_item_t rd_item_version, struct object **gear)
{
	uint8_t code;
	struct object *last_gear_obj = NULL;

	/* Get the first item code */
	rd_byte(&code);

	/* Read until done */
	while (code != FINISHED_CODE) {
		struct object *obj = (*rd_item_version)();

		/* Read the item */
		if (!obj) {
			note("Error reading item");
			return (-1);
		}

		/* Append the object */
		obj->prev = last_gear_obj;
		if (last_gear_obj)
			last_gear_obj->next = obj;
		else
			*gear = obj;
		last_gear_obj = obj;

		/* If it's equipment, wield it */
		if (code < player->body.count) {
			player->body.slots[code].obj = obj;
			player->upkeep->equip_cnt++;
		}

		/* Get the next item code */
		rd_byte(&code);
	}

	/* Success */
	return (0);
}